

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

AutoFile * __thiscall
node::BlockManager::OpenUndoFile(BlockManager *this,FlatFilePos *pos,bool fReadOnly)

{
  long lVar1;
  byte bVar2;
  byte in_CL;
  vector<std::byte,_std::allocator<std::byte>_> *in_RDX;
  vector<std::byte,_std::allocator<std::byte>_> *in_RSI;
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  bool unaff_retaddr;
  FlatFilePos *in_stack_00000008;
  FlatFileSeq *in_stack_00000010;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_ffffffffffffffb0;
  FILE *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_CL & 1;
  FlatFileSeq::Open(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(in_RSI,in_RDX);
  AutoFile::AutoFile((AutoFile *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
                     ,in_stack_ffffffffffffffb0);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile BlockManager::OpenUndoFile(const FlatFilePos& pos, bool fReadOnly) const
{
    return AutoFile{m_undo_file_seq.Open(pos, fReadOnly), m_xor_key};
}